

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
cs::method_import_as::preprocess
          (method_import_as *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  value_type ptVar2;
  token_base *ptVar3;
  _Elt_pointer pdVar4;
  int iVar5;
  const_reference pptVar6;
  token_base **pptVar7;
  statement_import *this_00;
  _Elt_pointer pptVar8;
  internal_error *this_01;
  compile_error *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
  __l;
  var ext;
  allocator_type local_89;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
  local_88;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  local_50;
  statement_import *local_38;
  
  pptVar6 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar6;
  pptVar6 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
  ptVar2 = *pptVar6;
  local_88.first._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
  if (*pptVar7 != (token_base *)0x0) {
    ext.mDat = (proxy *)ptVar2[1]._vptr_token_base;
    pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)&ext);
    if (*pptVar7 != (token_base *)0x0) {
      local_88.first._M_dataplus._M_p = (pointer)ptVar2[1]._vptr_token_base;
      pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
      ptVar3 = *pptVar7;
      iVar5 = (*ptVar3->_vptr_token_base[2])(ptVar3);
      if (iVar5 == 4) {
        get_namespace((method_import_as *)&ext,(context_t *)this,(iterator)context);
        compiler_type::add_constant
                  ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->compiler).
                   super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&ext);
        name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ptVar3 + 3);
        size = name;
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage,name,&ext);
        this_00 = (statement_import *)
                  statement_base::operator_new((statement_base *)0x38,(size_t)size);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
        ::pair<cs_impl::any_&,_true>(&local_88,name,&ext);
        __l._M_len = 1;
        __l._M_array = &local_88;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ::vector(&local_50,__l,&local_89);
        std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   &context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
        pdVar4 = (raw->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar8 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar8 ==
            (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar8 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        statement_import::statement_import(this_00,&local_50,(context_t *)&local_60,pptVar8[-1]);
        local_38 = this_00;
        std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
        emplace_back<cs::statement_import*>
                  ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&this->mResult,
                   &local_38);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        ::~vector(&local_50);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
        ::~pair(&local_88);
        cs_impl::any::recycle(&ext);
        return;
      }
      this_02 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_88,"Wrong grammar for import-as statement, expect <id> in alias.",
                 (allocator *)&ext);
      compile_error::compile_error(this_02,&local_88.first);
      __cxa_throw(this_02,&compile_error::typeinfo,compile_error::~compile_error);
    }
  }
  this_01 = (internal_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_88,"Null pointer accessed.",(allocator *)&ext);
  internal_error::internal_error(this_01,&local_88.first);
  __cxa_throw(this_01,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

void method_import_as::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree_package = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		tree_type<token_base *> &tree_alias = static_cast<token_expr *>(raw.front().at(3))->get_tree();
		if (tree_package.root().data() == nullptr || tree_alias.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		token_base *token_alias = tree_alias.root().data();
		if (token_alias->get_type() != token_types::id)
			throw compile_error("Wrong grammar for import-as statement, expect <id> in alias.");
		const string &alias_name = static_cast<token_id *>(token_alias)->get_id().get_id();
		var ext = get_namespace(context, tree_package.root());
		context->compiler->add_constant(ext);
		context->instance->storage.add_var_no_return(alias_name, ext);
		mResult.emplace_back(new statement_import({{alias_name, ext}}, context, raw.front().back()));
	}